

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O2

vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> * __thiscall
pbrt::RandomSampler::Clone
          (vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *__return_storage_ptr__
          ,RandomSampler *this,int n,Allocator alloc)

{
  uint64_t uVar1;
  int iVar2;
  RandomSampler *pRVar3;
  ulong uVar4;
  RandomSampler *pRVar5;
  ulong uVar6;
  allocator_type local_31;
  polymorphic_allocator<std::byte> local_30;
  
  local_30.memoryResource = alloc.memoryResource;
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::vector
            (__return_storage_ptr__,(long)n,&local_31);
  pRVar3 = pstd::pmr::polymorphic_allocator<std::byte>::allocate_object<pbrt::RandomSampler>
                     (&local_30,(long)n);
  pRVar5 = pRVar3;
  for (uVar4 = 0; (uint)(~(n >> 0x1f) & n) != uVar4; uVar4 = uVar4 + 1) {
    (pRVar3->rng).inc = (this->rng).inc;
    uVar6 = (ulong)pRVar5 | 0x1000000000000;
    pRVar5 = pRVar5 + 1;
    iVar2 = this->seed;
    uVar1 = (this->rng).state;
    pRVar3->samplesPerPixel = this->samplesPerPixel;
    pRVar3->seed = iVar2;
    (pRVar3->rng).state = uVar1;
    pRVar3 = pRVar3 + 1;
    (__return_storage_ptr__->
    super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar4].
    super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
    .bits = uVar6;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SamplerHandle> RandomSampler::Clone(int n, Allocator alloc) {
    std::vector<SamplerHandle> samplers(n);
    RandomSampler *samplerMem = (RandomSampler *)alloc.allocate_object<RandomSampler>(n);
    for (int i = 0; i < n; ++i) {
        alloc.construct(&samplerMem[i], *this);
        samplers[i] = &samplerMem[i];
    }
    return samplers;
}